

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.h
# Opt level: O1

bool __thiscall
vo::OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
          (OpticalFlowPatch<float,_vo::Pattern51<float>_> *this,Image<const_unsigned_short> *img,
          Matrix2P *transformed_pattern,VectorP *residual)

{
  float fVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  size_t sVar4;
  size_t sVar5;
  int i_1;
  int iVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  int i;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  sVar4 = img->w;
  sVar5 = img->h;
  sVar2 = img->pitch;
  puVar3 = img->ptr;
  fVar13 = 0.0;
  lVar10 = 0;
  iVar9 = 0;
  do {
    fVar15 = (transformed_pattern->super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>).
             m_storage.m_data.array[lVar10 * 2];
    if ((((fVar15 < 2.0) || ((float)(int)sVar4 + -2.0 + -1.0 <= fVar15)) ||
        (fVar1 = (transformed_pattern->super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>
                 ).m_storage.m_data.array[lVar10 * 2 + 1], fVar1 < 2.0)) ||
       ((float)(int)sVar5 + -2.0 + -1.0 <= fVar1)) {
      (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
      array[lVar10] = -1.0;
    }
    else {
      fVar1 = (transformed_pattern->super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>).
              m_storage.m_data.array[lVar10 * 2 + 1];
      fVar14 = fVar15 - (float)(int)fVar15;
      fVar16 = fVar1 - (float)(int)fVar1;
      lVar11 = (long)(int)fVar15;
      lVar8 = sVar2 * (long)(int)fVar1;
      lVar12 = (long)((int)fVar1 + 1) * sVar2;
      fVar15 = (float)*(ushort *)((long)puVar3 + lVar11 * 2 + lVar12 + 2) * fVar16 * fVar14 +
               (float)*(ushort *)((long)puVar3 + lVar11 * 2 + lVar8 + 2) * (1.0 - fVar16) * fVar14 +
               (float)*(ushort *)((long)puVar3 + lVar11 * 2 + lVar12) * (1.0 - fVar14) * fVar16 +
               (float)*(ushort *)((long)puVar3 + lVar11 * 2 + lVar8) *
               (1.0 - fVar14) * (1.0 - fVar16);
      (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
      array[lVar10] = fVar15;
      fVar13 = fVar13 + fVar15;
      iVar9 = iVar9 + 1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x34);
  if (1.1920929e-07 <= fVar13) {
    lVar10 = 0;
    iVar6 = 0;
    do {
      fVar15 = (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.
               m_data.array[lVar10];
      if ((fVar15 < 0.0) ||
         (fVar1 = (this->data).super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>.
                  m_storage.m_data.array[lVar10], fVar1 < 0.0)) {
        (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
        array[lVar10] = 0.0;
      }
      else {
        (residual->super_PlainObjectBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>).m_storage.m_data.
        array[lVar10] = (fVar15 * (float)iVar9) / fVar13 - fVar1;
        iVar6 = iVar6 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x34);
    bVar7 = 0x1a < iVar6;
  }
  else {
    bVar7 = false;
    memset(residual,0,0xd0);
  }
  return bVar7;
}

Assistant:

inline bool residual(const Image<const uint16_t> &img,
                       const Matrix2P &transformed_pattern,
                       VectorP &residual) const {
    Scalar sum = 0;
    int num_valid_points = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (img.InBounds(transformed_pattern.col(i), 2)) {
        residual[i] = img.interp<Scalar>(transformed_pattern.col(i));
        sum += residual[i];
        num_valid_points++;
      } else {
        residual[i] = -1;
      }
    }

    // all-black patch cannot be normalized
    if (sum < std::numeric_limits<Scalar>::epsilon()) {
      residual.setZero();
      return false;
    }

    int num_residuals = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (residual[i] >= 0 && data[i] >= 0) {
        const Scalar val = residual[i];
        residual[i] = num_valid_points * val / sum - data[i];
        num_residuals++;

      } else {
        residual[i] = 0;
      }
    }

    return num_residuals > PATTERN_SIZE / 2;
  }